

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

ssize_t read_block(int fd,void *buf,size_t nbyte)

{
  long local_38;
  size_t total;
  ssize_t rd;
  size_t nbyte_local;
  void *buf_local;
  ssize_t sStack_10;
  int fd_local;
  
  local_38 = 0;
  rd = nbyte;
  nbyte_local = (size_t)buf;
  while (sStack_10 = read(fd,(void *)nbyte_local,rd), 0 < sStack_10) {
    rd = rd - sStack_10;
    nbyte_local = nbyte_local + sStack_10;
    local_38 = sStack_10 + local_38;
  }
  if (-1 < sStack_10) {
    sStack_10 = local_38;
  }
  return sStack_10;
}

Assistant:

ssize_t read_block(int fd, void *buf, size_t nbyte) {
  ssize_t rd;
  size_t total;
  total = 0;
  while ((rd = read(fd, buf, nbyte)) > 0) {
    nbyte -= rd;
    buf = (char *)buf + rd;
    total += rd;
  }
  if (rd < 0) {
    return rd;
  } else {
    return total;
  }
}